

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  long lVar2;
  XML_Convert_Result XVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  unsigned_short **ppuVar9;
  char **ppcVar10;
  char **ppcVar11;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *pcVar12;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  unsigned_short *in_R8;
  char **ppcVar13;
  char **ppcVar14;
  bool bVar15;
  char **local_48;
  char **local_40;
  char *local_38;
  uint uVar8;
  
  uVar5 = (long)end - (long)ptr;
  if ((long)uVar5 < 1) {
    return -1;
  }
  local_38 = end + -2;
  bVar15 = false;
  pcVar12 = end;
  local_48 = (char **)ptr;
LAB_0017a6c1:
  ppcVar13 = local_48;
  uVar8 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)local_48);
  uVar7 = uVar8 - 5;
  ppcVar14 = ppcVar13;
  if (0x16 < uVar7) goto switchD_0017a6e1_caseD_8;
  ppuVar9 = (unsigned_short **)
            ((long)&switchD_0017a6e1::switchdataD_001a7bb8 +
            (long)(int)(&switchD_0017a6e1::switchdataD_001a7bb8)[uVar7]);
  switch(uVar8) {
  case 5:
    if (uVar5 == 1) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[0])(enc,(char *)local_48,pcVar12,(char **)ppuVar9);
    if ((iVar4 == 0) &&
       (XVar3 = (*enc[2].utf16Convert)(enc,ppcVar13,extraout_RDX_00,ppuVar9,in_R8),
       XVar3 != XML_CONVERT_COMPLETED)) {
      local_48 = (char **)((long)ppcVar13 + 2);
      pcVar12 = extraout_RDX_01;
      goto LAB_0017a6eb;
    }
    break;
  case 6:
    if (uVar5 < 3) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[1])(enc,(char *)local_48,pcVar12,(char **)ppuVar9);
    if ((iVar4 == 0) && (iVar4 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar13), iVar4 != 0)) {
      local_48 = (char **)((long)ppcVar13 + 3);
      pcVar12 = extraout_RDX;
      goto LAB_0017a6eb;
    }
    break;
  case 7:
    if (uVar5 < 4) {
      return -2;
    }
    iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)local_48,pcVar12,(char *)ppuVar9);
    if ((iVar4 == 0) &&
       (iVar4 = (*enc[3].scanners[0])(enc,(char *)ppcVar13,extraout_RDX_02,(char **)ppuVar9),
       iVar4 != 0)) {
      local_48 = (char **)((long)ppcVar13 + 4);
      pcVar12 = extraout_RDX_03;
      goto LAB_0017a6eb;
    }
    break;
  case 9:
  case 10:
  case 0x15:
    ppcVar13 = (char **)((long)local_48 + 1);
    lVar6 = (long)end - (long)ppcVar13;
    while( true ) {
      if (lVar6 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
      if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
      ppcVar13 = (char **)((long)ppcVar13 + 1);
      lVar6 = lVar6 + -1;
    }
    ppcVar14 = ppcVar13;
    if (bVar1 == 0xe) goto switchD_0017a6e1_caseD_e;
    break;
  case 0xe:
switchD_0017a6e1_caseD_e:
    ppcVar14 = (char **)((long)ppcVar13 + 1);
    if ((char **)end == ppcVar14 || (long)end - (long)ppcVar14 < 0) {
      return -1;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar14);
    uVar7 = (uint)bVar1;
    if ((bVar1 & 0xfe) != 0xc) {
      lVar6 = (long)local_38 - (long)ppcVar13;
      do {
        ppcVar13 = ppcVar14;
        ppcVar14 = ppcVar13;
        if ((0x15 < (byte)uVar7) || ((0x200600U >> (uVar7 & 0x1f) & 1) == 0))
        goto switchD_0017a6e1_caseD_8;
        if (lVar6 < 1) {
          return -1;
        }
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)((long)ppcVar13 + 1));
        uVar7 = (uint)bVar1;
        lVar6 = lVar6 + -1;
        ppcVar14 = (char **)((long)ppcVar13 + 1);
      } while ((bVar1 & 0xfe) != 0xc);
    }
LAB_0017a7b1:
    local_48 = (char **)((long)ppcVar13 + 2);
    do {
      while( true ) {
        ppcVar13 = local_48;
        uVar5 = (long)end - (long)local_48;
        if ((long)uVar5 < 1) {
          return -1;
        }
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)local_48);
        if (bVar1 == (byte)uVar7) {
          ppcVar14 = (char **)((long)local_48 + 1);
          if ((char **)end == ppcVar14 || (long)end - (long)ppcVar14 < 0) {
            return -1;
          }
          bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar14);
          uVar7 = (uint)bVar1;
          if (bVar1 < 0xb) {
            if (1 < uVar7 - 9) goto switchD_0017a6e1_caseD_8;
          }
          else if (bVar1 != 0x15) {
            if (uVar7 == 0xb) goto LAB_0017ac48;
            local_48 = ppcVar14;
            if (uVar7 == 0x11) goto LAB_0017ac69;
            goto LAB_0017ac9c;
          }
          ppcVar10 = (char **)((long)local_48 + 2);
          if ((char **)end == ppcVar10 || (long)end - (long)ppcVar10 < 0) {
            return -1;
          }
          pcVar12 = (char *)0x2;
          lVar6 = 0;
          goto LAB_0017aaf1;
        }
        uVar8 = (uint)bVar1;
        if (uVar8 < 9) break;
switchD_0017a7f8_caseD_4:
        local_48 = (char **)((long)local_48 + 1);
      }
      ppcVar10 = (char **)((long)&switchD_0017a7f8::switchdataD_001a7c14 +
                          (long)(int)(&switchD_0017a7f8::switchdataD_001a7c14)[uVar8]);
      ppcVar14 = ppcVar13;
      switch(uVar8) {
      default:
        goto switchD_0017a6e1_caseD_8;
      case 3:
        iVar4 = normal_scanRef(enc,(char *)((long)local_48 + 1),end,(char **)&local_48);
        if (iVar4 < 1) {
          if (iVar4 != 0) {
            return iVar4;
          }
          goto LAB_0017ac9c;
        }
        break;
      case 4:
        goto switchD_0017a7f8_caseD_4;
      case 5:
        goto switchD_0017a7f8_caseD_5;
      case 6:
        if (uVar5 < 3) {
          return -2;
        }
        iVar4 = (*enc[3].literalScanners[1])
                          (enc,(char *)local_48,(char *)&switchD_0017a7f8::switchdataD_001a7c14,
                           ppcVar10);
        if (iVar4 != 0) goto switchD_0017a6e1_caseD_8;
        local_48 = (char **)((long)ppcVar13 + 3);
        break;
      case 7:
        if (uVar5 < 4) {
          return -2;
        }
        iVar4 = (*enc[3].nameMatchesAscii)
                          (enc,(char *)local_48,(char *)&switchD_0017a7f8::switchdataD_001a7c14,
                           (char *)ppcVar10);
        if (iVar4 != 0) goto switchD_0017a6e1_caseD_8;
        local_48 = (char **)((long)ppcVar13 + 4);
      }
    } while( true );
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    local_48 = (char **)((long)local_48 + 1);
    goto LAB_0017a6eb;
  case 0x17:
    if (!bVar15) {
      ppcVar14 = (char **)((long)local_48 + 1);
      uVar5 = (long)end - (long)ppcVar14;
      if ((long)uVar5 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar14);
      ppcVar10 = (char **)(ulong)bVar1;
      if (bVar1 < 7) {
        if (bVar1 == 5) {
          if (uVar5 == 1) {
            return -2;
          }
          local_48 = ppcVar14;
          iVar4 = (*enc[3].literalScanners[0])(enc,(char *)ppcVar14,pcVar12,ppcVar10);
          if ((iVar4 == 0) &&
             (iVar4 = (*enc[3].scanners[1])(enc,(char *)ppcVar14,extraout_RDX_06,ppcVar10),
             iVar4 != 0)) {
            local_48 = (char **)((long)ppcVar13 + 3);
            pcVar12 = extraout_RDX_07;
            goto LAB_0017aab8;
          }
        }
        else if (bVar1 == 6) {
          if (uVar5 < 3) {
            return -2;
          }
          local_48 = ppcVar14;
          iVar4 = (*enc[3].literalScanners[1])(enc,(char *)ppcVar14,pcVar12,ppcVar10);
          if ((iVar4 == 0) &&
             (iVar4 = (*enc[3].scanners[2])(enc,(char *)ppcVar14,extraout_RDX_04,ppcVar10),
             iVar4 != 0)) {
            local_48 = (char **)((long)ppcVar13 + 4);
            pcVar12 = extraout_RDX_05;
            goto LAB_0017aab8;
          }
        }
      }
      else if (bVar1 == 7) {
        if (uVar5 < 4) {
          return -2;
        }
        local_48 = ppcVar14;
        iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)ppcVar14,pcVar12,(char *)ppcVar10);
        if ((iVar4 == 0) &&
           (iVar4 = (*enc[3].scanners[3])(enc,(char *)ppcVar14,extraout_RDX_08,ppcVar10), iVar4 != 0
           )) {
          local_48 = (char **)((long)ppcVar13 + 5);
          pcVar12 = extraout_RDX_09;
          goto LAB_0017aab8;
        }
      }
      else if ((bVar1 == 0x18) || (bVar1 == 0x16)) {
        local_48 = (char **)((long)local_48 + 2);
LAB_0017aab8:
        bVar15 = true;
        goto LAB_0017a6eb;
      }
    }
  }
  goto switchD_0017a6e1_caseD_8;
LAB_0017aaf1:
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)((long)local_48 + (long)pcVar12)))
  {
  case 5:
    goto switchD_0017ab19_caseD_5;
  case 6:
    ppcVar11 = (char **)(end + (lVar6 - (long)local_48) + -2);
    if (ppcVar11 < (char **)0x3) {
      return -2;
    }
    local_40 = (char **)((long)local_48 + (2 - lVar6));
    local_48 = ppcVar14;
    iVar4 = (*enc[3].literalScanners[1])(enc,(char *)local_40,pcVar12,ppcVar11);
    ppcVar14 = ppcVar10;
    if ((iVar4 != 0) ||
       (iVar4 = (*enc[3].scanners[2])(enc,(char *)local_40,extraout_RDX_14,ppcVar11), iVar4 == 0))
    goto switchD_0017a6e1_caseD_8;
    local_48 = (char **)((long)ppcVar13 + (5 - lVar6));
    pcVar12 = extraout_RDX_15;
    goto LAB_0017ac15;
  case 7:
    ppcVar11 = (char **)(end + (lVar6 - (long)local_48) + -2);
    if (ppcVar11 < (char **)0x4) {
      return -2;
    }
    local_40 = (char **)((long)local_48 + (2 - lVar6));
    local_48 = ppcVar14;
    iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)local_40,pcVar12,(char *)ppcVar11);
    ppcVar14 = local_40;
    if ((iVar4 != 0) ||
       (iVar4 = (*enc[3].scanners[3])(enc,(char *)local_40,extraout_RDX_10,ppcVar11),
       ppcVar14 = ppcVar10, iVar4 == 0)) goto switchD_0017a6e1_caseD_8;
    local_48 = (char **)((long)ppcVar13 + (6 - lVar6));
    pcVar12 = extraout_RDX_11;
    goto LAB_0017ac15;
  default:
    ppcVar14 = (char **)((long)local_48 + (2 - lVar6));
    goto switchD_0017a6e1_caseD_8;
  case 9:
  case 10:
  case 0x15:
    goto switchD_0017ab19_caseD_9;
  case 0xb:
    ppcVar14 = (char **)((long)local_48 + (2 - lVar6));
LAB_0017ac48:
    local_48 = (char **)((long)ppcVar14 + 1);
    iVar4 = 1;
    break;
  case 0x11:
    ppcVar14 = (char **)((long)local_48 + (2 - lVar6));
LAB_0017ac69:
    local_48 = (char **)((long)ppcVar14 + 1);
    if ((char **)end == local_48 || (long)end - (long)local_48 < 0) {
      return -1;
    }
    bVar15 = *(byte *)((long)ppcVar14 + 1) == 0x3e;
    if (bVar15) {
      local_48 = (char **)((long)ppcVar14 + 2);
    }
    iVar4 = (uint)bVar15 * 3;
    break;
  case 0x16:
  case 0x18:
    local_48 = (char **)((long)local_48 + (3 - lVar6));
    goto LAB_0017ac15;
  }
  goto LAB_0017ac9e;
switchD_0017ab19_caseD_9:
  ppcVar10 = (char **)((long)ppcVar10 + 1);
  lVar2 = lVar6 - (long)local_48;
  lVar6 = lVar6 + -1;
  pcVar12 = pcVar12 + 1;
  if (end + lVar2 == (char *)0x3 || (long)(end + lVar2 + -3) < 0) {
    return -1;
  }
  goto LAB_0017aaf1;
switchD_0017a7f8_caseD_5:
  if (uVar5 == 1) {
    return -2;
  }
  iVar4 = (*enc[3].literalScanners[0])
                    (enc,(char *)local_48,(char *)&switchD_0017a7f8::switchdataD_001a7c14,ppcVar10);
  if (iVar4 != 0) goto switchD_0017a6e1_caseD_8;
  goto LAB_0017a7b1;
switchD_0017ab19_caseD_5:
  ppcVar11 = (char **)(end + (lVar6 - (long)local_48));
  if (ppcVar11 == (char **)0x3) {
    return -2;
  }
  local_40 = (char **)((long)local_48 + (2 - lVar6));
  local_48 = ppcVar14;
  iVar4 = (*enc[3].literalScanners[0])(enc,(char *)local_40,pcVar12,ppcVar11);
  ppcVar14 = ppcVar10;
  if ((iVar4 == 0) &&
     (iVar4 = (*enc[3].scanners[1])(enc,(char *)local_40,extraout_RDX_12,ppcVar11), iVar4 != 0)) {
    local_48 = (char **)((long)ppcVar13 + (4 - lVar6));
    pcVar12 = extraout_RDX_13;
LAB_0017ac15:
    bVar15 = false;
LAB_0017a6eb:
    uVar5 = (long)end - (long)local_48;
    if ((long)uVar5 < 1) {
      return -1;
    }
    goto LAB_0017a6c1;
  }
switchD_0017a6e1_caseD_8:
  local_48 = ppcVar14;
LAB_0017ac9c:
  iVar4 = 0;
LAB_0017ac9e:
  *nextTokPtr = (char *)local_48;
  return iVar4;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr) {
#  ifdef XML_NS
  int hadColon = 0;
#  endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#  ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#  endif
    case BT_S:
    case BT_CR:
    case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_EQUALS: {
      int open;
#  ifdef XML_NS
      hadColon = 0;
#  endif
      for (;;) {
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        open = BYTE_TYPE(enc, ptr);
        if (open == BT_QUOT || open == BT_APOS)
          break;
        switch (open) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      ptr += MINBPC(enc);
      /* in attribute value */
      for (;;) {
        int t;
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == open)
          break;
        switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
        case BT_AMP: {
          int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
          if (tok <= 0) {
            if (tok == XML_TOK_INVALID)
              *nextTokPtr = ptr;
            return tok;
          }
          break;
        }
        case BT_LT:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_CR:
      case BT_LF:
        break;
      case BT_SOL:
        goto sol;
      case BT_GT:
        goto gt;
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      /* ptr points to closing quote */
      for (;;) {
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
        case BT_S:
        case BT_CR:
        case BT_LF:
          continue;
        case BT_GT:
        gt:
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_START_TAG_WITH_ATTS;
        case BT_SOL:
        sol:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        break;
      }
      break;
    }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}